

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

shared_ptr<kratos::EventTracingStmt> __thiscall
kratos::EventTracingStmt::starts(EventTracingStmt *this,string *transaction_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::EventTracingStmt> sVar1;
  undefined1 local_30 [24];
  string *transaction_name_local;
  EventTracingStmt *this_local;
  
  transaction_name_local = transaction_name;
  this_local = this;
  belongs((EventTracingStmt *)local_30,transaction_name);
  std::__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_30);
  starts(this);
  std::shared_ptr<kratos::EventTracingStmt>::~shared_ptr
            ((shared_ptr<kratos::EventTracingStmt> *)local_30);
  sVar1.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::EventTracingStmt>)
         sVar1.super___shared_ptr<kratos::EventTracingStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EventTracingStmt> EventTracingStmt::starts(const std::string &transaction_name) {
    return belongs(transaction_name)->starts();
}